

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACTable.cpp
# Opt level: O0

bool __thiscall FDInfo::UpdateFrom(FDInfo *this,LTFlightData *fd)

{
  double *pdVar1;
  FlightModel *pFVar2;
  bool bVar3;
  flightPhaseE fVar4;
  int iVar5;
  uint uVar6;
  reference pvVar7;
  char *pcVar8;
  Doc8643 *pDVar9;
  positionTy *ppVar10;
  reference pvVar11;
  string *psVar12;
  ulong uVar13;
  const_iterator pAVar14;
  const_reference this_00;
  LTFlightData *in_RSI;
  FDKeyTy *in_RDI;
  float fVar15;
  double dVar16;
  double dVar17;
  vectorTy vecCam;
  positionTy *firstPos;
  dequePositionTy *posDeque;
  size_t idx;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<ACTColumnsTy> *__range3;
  LTAircraft *pAc;
  FDDynamicData dyn;
  FDStaticData stat;
  char s [50];
  positionTy *in_stack_fffffffffffff718;
  undefined4 in_stack_fffffffffffff720;
  undefined4 uVar18;
  float in_stack_fffffffffffff724;
  string *in_stack_fffffffffffff728;
  deque<positionTy,_std::allocator<positionTy>_> *in_stack_fffffffffffff730;
  string *in_stack_fffffffffffff750;
  FDStaticData *in_stack_fffffffffffff758;
  long in_stack_fffffffffffff768;
  FDStaticData *in_stack_fffffffffffff770;
  LTFlightData *in_stack_fffffffffffff778;
  undefined7 in_stack_fffffffffffff788;
  undefined1 in_stack_fffffffffffff78f;
  FDDynamicData *in_stack_fffffffffffff7c0;
  LTFlightData *in_stack_fffffffffffff7c8;
  LTAircraft *in_stack_fffffffffffff7d8;
  LTAircraft *in_stack_fffffffffffff838;
  double local_3f8;
  double local_3f0;
  const_iterator local_3b8;
  ACTColumnsTy local_3ac [21];
  initializer_list<ACTColumnsTy> local_358;
  initializer_list<ACTColumnsTy> *local_348;
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  LTAircraft *local_2e0;
  string local_2d8 [72];
  double local_290;
  double local_288;
  LTChannel *local_278;
  string local_270 [32];
  string local_250 [32];
  string local_230 [48];
  string local_200 [64];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [56];
  string local_128 [56];
  string local_f0 [64];
  string local_b0 [72];
  string local_68 [32];
  char local_48 [56];
  LTFlightData *local_10;
  
  in_RDI[0x1e].key.field_0x4 = 1;
  local_10 = in_RSI;
  LTFlightData::key(in_RSI);
  LTFlightData::FDKeyTy::operator=
            ((FDKeyTy *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
             (FDKeyTy *)in_stack_fffffffffffff718);
  LTFlightData::FDKeyTy::operator_cast_to_string((FDKeyTy *)in_stack_fffffffffffff718);
  pvVar7 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
           ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                         *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                        (size_type)in_stack_fffffffffffff718);
  std::__cxx11::string::operator=((string *)pvVar7,local_68);
  std::__cxx11::string::~string(local_68);
  pcVar8 = LTFlightData::FDKeyTy::GetKeyTypeText(in_RDI);
  pvVar7 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
           ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                         *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                        (size_type)in_stack_fffffffffffff718);
  std::__cxx11::string::operator=((string *)pvVar7,pcVar8);
  LTFlightData::FDStaticData::FDStaticData
            ((FDStaticData *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
  bVar3 = LTFlightData::TryGetSafeCopy(in_stack_fffffffffffff778,in_stack_fffffffffffff770);
  if (bVar3) {
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::string(local_250,(string *)pvVar7);
    LTFlightData::FDStaticData::acId(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_230);
    std::__cxx11::string::~string(local_230);
    std::__cxx11::string::~string(local_250);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_200);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_1c0);
    pDVar9 = Doc8643::get(in_stack_fffffffffffff728);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,(string *)&pDVar9->classification);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_1a0);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_180);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_160);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_b0);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_128);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_f0);
    LTFlightData::FDStaticData::route_abi_cxx11_((FDStaticData *)in_stack_fffffffffffff778);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_270);
    std::__cxx11::string::~string(local_270);
  }
  else {
    in_RDI[0x1e].key.field_0x4 = 0;
  }
  LTFlightData::FDDynamicData::FDDynamicData
            ((FDDynamicData *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
  bVar3 = LTFlightData::TryGetSafeCopy(in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
  if (bVar3) {
    std::__cxx11::to_string(in_stack_fffffffffffff768);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_2d8);
    std::__cxx11::string::~string(local_2d8);
    if (local_278 == (LTChannel *)0x0) {
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>::
      operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                  *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                 (size_type)in_stack_fffffffffffff718);
      std::__cxx11::string::clear();
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>::
      operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                  *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                 (size_type)in_stack_fffffffffffff718);
      std::__cxx11::string::clear();
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      *pvVar11 = NAN;
    }
    else {
      pcVar8 = LTChannel::ChName(local_278);
      pvVar7 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
               ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                             *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                            (size_type)in_stack_fffffffffffff718);
      std::__cxx11::string::operator=((string *)pvVar7,pcVar8);
      dVar17 = LTFlightData::GetYoungestTS(local_10);
      dVar16 = DataRefs::GetSimTime(&dataRefs);
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      *pvVar11 = (float)(dVar17 - dVar16);
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      snprintf(local_48,0x32,"%+.f",(double)*pvVar11);
      pvVar7 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
               ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                             *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                            (size_type)in_stack_fffffffffffff718);
      std::__cxx11::string::operator=((string *)pvVar7,local_48);
    }
  }
  else {
    in_RDI[0x1e].key.field_0x4 = 0;
  }
  local_2e0 = LTFlightData::GetAircraft(local_10);
  if (local_2e0 == (LTAircraft *)0x0) {
    std::
    array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>::
    operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
               (size_type)in_stack_fffffffffffff718);
    uVar13 = std::__cxx11::string::empty();
    if ((uVar13 & 1) == 0) {
      memcpy(local_3ac,&DAT_003835d8,0x54);
      local_358._M_array = local_3ac;
      local_358._M_len = 0x15;
      local_348 = &local_358;
      local_3b8 = std::initializer_list<ACTColumnsTy>::begin(local_348);
      pAVar14 = std::initializer_list<ACTColumnsTy>::end
                          ((initializer_list<ACTColumnsTy> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
      for (; local_3b8 != pAVar14; local_3b8 = local_3b8 + 1) {
        pvVar11 = std::array<float,_39UL>::operator[]
                            ((array<float,_39UL> *)
                             CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                             (size_type)in_stack_fffffffffffff718);
        *pvVar11 = NAN;
        std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
        ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                      *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                     (size_type)in_stack_fffffffffffff718);
        std::__cxx11::string::clear();
      }
    }
    LTFlightData::GetPosDeque(local_10);
    bVar3 = std::deque<positionTy,_std::allocator<positionTy>_>::empty
                      ((deque<positionTy,_std::allocator<positionTy>_> *)0x126493);
    if (!bVar3) {
      this_00 = std::deque<positionTy,_std::allocator<positionTy>_>::front
                          (in_stack_fffffffffffff730);
      dVar17 = positionTy::lat(this_00);
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      *pvVar11 = (float)dVar17;
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      snprintf(local_48,0x32,"%.4f",(double)*pvVar11);
      pvVar7 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
               ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                             *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                            (size_type)in_stack_fffffffffffff718);
      std::__cxx11::string::operator=((string *)pvVar7,local_48);
      dVar17 = positionTy::lon(this_00);
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      *pvVar11 = (float)dVar17;
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      snprintf(local_48,0x32,"%.4f",(double)*pvVar11);
      pvVar7 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
               ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                             *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                            (size_type)in_stack_fffffffffffff718);
      std::__cxx11::string::operator=((string *)pvVar7,local_48);
      dVar17 = positionTy::alt_ft((positionTy *)0x12665b);
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      *pvVar11 = (float)dVar17;
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      snprintf(local_48,0x32,"%.f",(double)*pvVar11);
      pvVar7 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
               ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                             *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                            (size_type)in_stack_fffffffffffff718);
      std::__cxx11::string::operator=((string *)pvVar7,local_48);
      DataRefs::GetViewPos();
      positionTy::between((positionTy *)
                          CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          in_stack_fffffffffffff718);
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      *pvVar11 = (float)local_3f8;
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      snprintf(local_48,0x32,"%.f",(double)*pvVar11);
      pvVar7 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
               ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                             *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                            (size_type)in_stack_fffffffffffff718);
      std::__cxx11::string::operator=((string *)pvVar7,local_48);
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      *pvVar11 = (float)(local_3f0 / 1852.0);
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      snprintf(local_48,0x32,"%.1f",(double)*pvVar11);
      pvVar7 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
               ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                             *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                            (size_type)in_stack_fffffffffffff718);
      std::__cxx11::string::operator=((string *)pvVar7,local_48);
      dVar17 = positionTy::heading(this_00);
      uVar6 = std::isnan(dVar17);
      if ((uVar6 & 1) == 0) {
        dVar17 = positionTy::heading(this_00);
        pvVar11 = std::array<float,_39UL>::operator[]
                            ((array<float,_39UL> *)
                             CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                             (size_type)in_stack_fffffffffffff718);
        *pvVar11 = (float)dVar17;
        pvVar11 = std::array<float,_39UL>::operator[]
                            ((array<float,_39UL> *)
                             CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                             (size_type)in_stack_fffffffffffff718);
        pcVar8 = local_48;
        snprintf(pcVar8,0x32,"%.f",(double)*pvVar11);
        pvVar7 = std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                 ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                               *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                              (size_type)in_stack_fffffffffffff718);
        std::__cxx11::string::operator=((string *)pvVar7,pcVar8);
      }
    }
    uVar6 = std::isnan(local_290);
    if ((uVar6 & 1) == 0) {
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      *pvVar11 = (float)local_290;
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      pcVar8 = local_48;
      snprintf(pcVar8,0x32,"%.f",(double)*pvVar11);
      pvVar7 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
               ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                             *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                            (size_type)in_stack_fffffffffffff718);
      std::__cxx11::string::operator=((string *)pvVar7,pcVar8);
    }
    uVar6 = std::isnan(local_288);
    if ((uVar6 & 1) == 0) {
      in_stack_fffffffffffff724 = (float)local_288;
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      *pvVar11 = in_stack_fffffffffffff724;
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      snprintf(local_48,0x32,"%.f",(double)*pvVar11);
      pvVar7 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
               ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                             *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                            (size_type)in_stack_fffffffffffff718);
      std::__cxx11::string::operator=((string *)pvVar7,local_48);
    }
  }
  else {
    LTAircraft::RelativePositionText_abi_cxx11_(in_stack_fffffffffffff838);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_300);
    std::__cxx11::string::~string(local_300);
    ppVar10 = LTAircraft::GetPPos(local_2e0);
    dVar17 = positionTy::lat(ppVar10);
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    *pvVar11 = (float)dVar17;
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    snprintf(local_48,0x32,"%.4f",(double)*pvVar11);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_48);
    ppVar10 = LTAircraft::GetPPos(local_2e0);
    dVar17 = positionTy::lon(ppVar10);
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    *pvVar11 = (float)dVar17;
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    snprintf(local_48,0x32,"%.4f",(double)*pvVar11);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_48);
    dVar17 = LTAircraft::GetAlt_ft((LTAircraft *)0x1255e3);
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    *pvVar11 = (float)dVar17;
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    snprintf(local_48,0x32,"%.f",(double)*pvVar11);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_48);
    dVar17 = LTAircraft::GetPHeight_ft((LTAircraft *)0x1256b2);
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    *pvVar11 = (float)dVar17;
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    snprintf(local_48,0x32,"%.f",(double)*pvVar11);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_48);
    dVar17 = LTAircraft::GetVSI_ft(local_2e0);
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    *pvVar11 = (float)dVar17;
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    snprintf(local_48,0x32,"%.f",(double)*pvVar11);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_48);
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    if (-local_2e0->pMdl->VSI_STABLE <= (double)*pvVar11) {
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      pdVar1 = &local_2e0->pMdl->VSI_STABLE;
      if ((double)*pvVar11 < *pdVar1 || (double)*pvVar11 == *pdVar1) {
        std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
        ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                      *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                     (size_type)in_stack_fffffffffffff718);
        std::__cxx11::string::clear();
      }
      else {
        pvVar7 = std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                 ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                               *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                              (size_type)in_stack_fffffffffffff718);
        std::__cxx11::string::operator=((string *)pvVar7,anon_var_dwarf_5099);
      }
    }
    else {
      pvVar7 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
               ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                             *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                            (size_type)in_stack_fffffffffffff718);
      std::__cxx11::string::operator=((string *)pvVar7,anon_var_dwarf_50a4);
    }
    dVar17 = LTAircraft::GetSpeed_kt((LTAircraft *)0x12594e);
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    *pvVar11 = (float)dVar17;
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    snprintf(local_48,0x32,"%.f",(double)*pvVar11);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_48);
    dVar17 = LTAircraft::GetTrack(local_2e0);
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    *pvVar11 = (float)dVar17;
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    snprintf(local_48,0x32,"%.f",(double)*pvVar11);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_48);
    dVar17 = LTAircraft::GetHeading
                       ((LTAircraft *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720))
    ;
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    *pvVar11 = (float)dVar17;
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    snprintf(local_48,0x32,"%.f",(double)*pvVar11);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_48);
    dVar17 = LTAircraft::GetPitch((LTAircraft *)0x125bbb);
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    *pvVar11 = (float)dVar17;
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    snprintf(local_48,0x32,"%.1f",(double)*pvVar11);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_48);
    dVar17 = LTAircraft::GetRoll((LTAircraft *)0x125c8a);
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    *pvVar11 = (float)dVar17;
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    snprintf(local_48,0x32,"%.1f",(double)*pvVar11);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_48);
    fVar15 = XPMP2::Aircraft::GetCameraBearing(&local_2e0->super_Aircraft);
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    *pvVar11 = fVar15;
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    snprintf(local_48,0x32,"%.f",(double)*pvVar11);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_48);
    fVar15 = XPMP2::Aircraft::GetCameraDist(&local_2e0->super_Aircraft);
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    *pvVar11 = fVar15 / 1852.0;
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    snprintf(local_48,0x32,"%.1f",(double)*pvVar11);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_48);
    psVar12 = XPMP2::Aircraft::GetModelName_abi_cxx11_
                        ((Aircraft *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,(string *)psVar12);
    LTAircraft::GetFlightPhaseRwyString_abi_cxx11_
              ((LTAircraft *)CONCAT17(in_stack_fffffffffffff78f,in_stack_fffffffffffff788));
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_320);
    std::__cxx11::string::~string(local_320);
    fVar4 = LTAircraft::GetFlightPhase(local_2e0);
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    *pvVar11 = (float)fVar4;
    dVar17 = LTAircraft::GetGearPos((LTAircraft *)0x125fcd);
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    *pvVar11 = (float)(dVar17 * 100.0);
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    snprintf(local_48,0x32,"%.f%%",(double)*pvVar11);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_48);
    dVar17 = LTAircraft::GetFlapsPos((LTAircraft *)0x1260a8);
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    *pvVar11 = (float)(dVar17 * 100.0);
    pvVar11 = std::array<float,_39UL>::operator[]
                        ((array<float,_39UL> *)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         (size_type)in_stack_fffffffffffff718);
    snprintf(local_48,0x32,"%.f%%",(double)*pvVar11);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_48);
    LTAircraft::GetLightsStr_abi_cxx11_(in_stack_fffffffffffff7d8);
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,local_340);
    std::__cxx11::string::~string(local_340);
    bVar3 = XPMP2::Aircraft::IsCurrentlyShownAsTcasTarget(&local_2e0->super_Aircraft);
    if (bVar3) {
      iVar5 = XPMP2::Aircraft::GetTcasTargetIdx(&local_2e0->super_Aircraft);
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      *pvVar11 = (float)iVar5;
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      snprintf(local_48,0x32,"%.f",(double)*pvVar11);
      pvVar7 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
               ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                             *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                            (size_type)in_stack_fffffffffffff718);
      std::__cxx11::string::operator=((string *)pvVar7,local_48);
    }
    else {
      pvVar11 = std::array<float,_39UL>::operator[]
                          ((array<float,_39UL> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           (size_type)in_stack_fffffffffffff718);
      *pvVar11 = NAN;
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>::
      operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                  *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                 (size_type)in_stack_fffffffffffff718);
      std::__cxx11::string::clear();
    }
    pFVar2 = local_2e0->pMdl;
    pvVar7 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
             ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
                           *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                          (size_type)in_stack_fffffffffffff718);
    std::__cxx11::string::operator=((string *)pvVar7,(string *)pFVar2);
  }
  uVar18 = CONCAT13(in_RDI[0x1e].key.field_0x4,(int3)in_stack_fffffffffffff720);
  LTFlightData::FDStaticData::~FDStaticData
            ((FDStaticData *)CONCAT44(in_stack_fffffffffffff724,uVar18));
  return (bool)((byte)((uint)uVar18 >> 0x18) & 1);
}

Assistant:

bool FDInfo::UpdateFrom (const LTFlightData& fd)
{
    // buffer and macro for converting numeric data
    char s[50];
#define v_f(idx,fmt,val) vf[idx] = float(val); snprintf(s, sizeof(s), fmt, vf[idx]); v[idx] = s;

    bUpToDate = true;
    v[ACT_COL_KEY] = key = fd.key();    // possible without lock
    v[ACT_COL_KEY_TYPE]  = key.GetKeyTypeText();

    // try fetching some static data
    LTFlightData::FDStaticData stat;
    if (fd.TryGetSafeCopy(stat)) {
        v[ACT_COL_ID]           = stat.acId(v[ACT_COL_KEY]);
        v[ACT_COL_REG]          = stat.reg;
        v[ACT_COL_TYPE]         = stat.acTypeIcao;
        v[ACT_COL_CLASS]        = Doc8643::get(stat.acTypeIcao).classification;
        v[ACT_COL_MAN]          = stat.man;
        v[ACT_COL_MDL]          = stat.mdl;
        v[ACT_COL_CAT_DESCR]    = stat.catDescr;
        v[ACT_COL_OP]           = stat.op;
        v[ACT_COL_CALLSIGN]     = stat.call;
        v[ACT_COL_FLIGHT]       = stat.flight;
        v[ACT_COL_ROUTE]        = stat.route();
    } else
        bUpToDate = false;
    
    // try fetching some dynamic data
    LTFlightData::FDDynamicData dyn;
    if (fd.TryGetSafeCopy(dyn)) {
        v[ACT_COL_SQUAWK]       = std::to_string(dyn.radar.code);
        if (dyn.pChannel) {
            v[ACT_COL_CHANNEL]  = dyn.pChannel->ChName();
            // last flight data / channel
            v_f(ACT_COL_LASTDATA, "%+.f", fd.GetYoungestTS() - dataRefs.GetSimTime());
        } else {
            v[ACT_COL_CHANNEL].clear();
            v[ACT_COL_LASTDATA].clear();
            vf[ACT_COL_LASTDATA] = NAN;
        }
    } else
        bUpToDate = false;
    
    
    // try fetching some actual flight data
    LTAircraft* pAc = fd.GetAircraft();
    if (pAc) {
        v[ACT_COL_POS]          = pAc->RelativePositionText();
        v_f(ACT_COL_LAT,    "%.4f",     pAc->GetPPos().lat());
        v_f(ACT_COL_LON,    "%.4f",     pAc->GetPPos().lon());
        v_f(ACT_COL_ALT,    "%.f",      pAc->GetAlt_ft());
        v_f(ACT_COL_AGL,    "%.f",      pAc->GetPHeight_ft());
        v_f(ACT_COL_VSI,    "%.f",      pAc->GetVSI_ft());
        if (vf[ACT_COL_VSI] < -pAc->pMdl->VSI_STABLE)     // up/down arrow depending on value of VSI
            v[ACT_COL_UPDOWN] = ICON_FA_CHEVRON_DOWN;
        else if (vf[ACT_COL_VSI] > pAc->pMdl->VSI_STABLE)
            v[ACT_COL_UPDOWN] = ICON_FA_CHEVRON_UP;
        else
            v[ACT_COL_UPDOWN].clear();
        v_f(ACT_COL_SPEED,  "%.f",      pAc->GetSpeed_kt());
        v_f(ACT_COL_TRACK,  "%.f",      pAc->GetTrack());
        v_f(ACT_COL_HEADING,"%.f",      pAc->GetHeading());
        v_f(ACT_COL_PITCH,  "%.1f",     pAc->GetPitch());
        v_f(ACT_COL_ROLL,   "%.1f",     pAc->GetRoll());
        v_f(ACT_COL_BEARING,"%.f",      pAc->GetCameraBearing());
        v_f(ACT_COL_DIST,   "%.1f",     pAc->GetCameraDist() / M_per_NM);
        
        v[ACT_COL_CSLMDL]       = pAc->GetModelName();
        v[ACT_COL_PHASE]        = pAc->GetFlightPhaseRwyString();
        vf[ACT_COL_PHASE]       = float(pAc->GetFlightPhase()); // sort flight phase by its index
        v_f(ACT_COL_GEAR,   "%.f%%",    pAc->GetGearPos() * 100.0);
        v_f(ACT_COL_FLAPS,  "%.f%%",    pAc->GetFlapsPos() * 100.0);
        v[ACT_COL_LIGHTS]       = pAc->GetLightsStr();
        if (pAc->IsCurrentlyShownAsTcasTarget()) {
            v_f(ACT_COL_TCAS_IDX, "%.f", pAc->GetTcasTargetIdx());
        } else {
            vf[ACT_COL_TCAS_IDX] = NAN;
            v[ACT_COL_TCAS_IDX].clear();
        }
        v[ACT_COL_FLIGHTMDL]    = pAc->pMdl->modelName;
            
    }
    else {
        // if there is no a/c, but there previously was, then we need to clear a lot of fields
        if (!v[ACT_COL_POS].empty()) {
            for (size_t idx: {
                ACT_COL_POS, ACT_COL_LAT, ACT_COL_LON, ACT_COL_ALT, ACT_COL_AGL,
                ACT_COL_VSI, ACT_COL_UPDOWN, ACT_COL_SPEED, ACT_COL_TRACK, ACT_COL_HEADING,
                ACT_COL_PITCH, ACT_COL_ROLL, ACT_COL_BEARING, ACT_COL_DIST,
                ACT_COL_CSLMDL, ACT_COL_PHASE, ACT_COL_GEAR, ACT_COL_FLAPS,
                ACT_COL_LIGHTS, ACT_COL_TCAS_IDX, ACT_COL_FLIGHTMDL
            })
            { vf[idx] = NAN; v[idx].clear(); }
        }
        
        // We can try finding some positional information in the pos deque
        const dequePositionTy& posDeque = fd.GetPosDeque();
        if (!posDeque.empty()) {
            const positionTy& firstPos = posDeque.front();
            v_f(ACT_COL_LAT,    "%.4f",     firstPos.lat());
            v_f(ACT_COL_LON,    "%.4f",     firstPos.lon());
            v_f(ACT_COL_ALT,    "%.f",      firstPos.alt_ft());
            const vectorTy vecCam = firstPos.between(dataRefs.GetViewPos());
            v_f(ACT_COL_BEARING,"%.f",      vecCam.angle);
            v_f(ACT_COL_DIST,   "%.1f",     vecCam.dist / M_per_NM);
            if (!std::isnan(firstPos.heading())) {
                v_f(ACT_COL_HEADING, "%.f", firstPos.heading());
            }
        }
        if (!std::isnan(dyn.spd)) {
            v_f(ACT_COL_SPEED,  "%.f",      dyn.spd);
        }
        if (!std::isnan(dyn.vsi)) {
            v_f(ACT_COL_VSI,    "%.f",      dyn.vsi);
        }
    }
    
    // Have we successfully updated?
    return bUpToDate;
}